

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
* __thiscall
Graph::color(pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             *__return_storage_ptr__,Graph *this,size_t colors)

{
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar1;
  pointer ppVar2;
  iterator iVar3;
  size_t *psVar4;
  pointer puVar5;
  unsigned_long uVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  _Elt_pointer puVar10;
  unsigned_long uVar11;
  pointer puVar12;
  unsigned_long uVar13;
  int iVar14;
  unsigned_long *i;
  size_t *psVar15;
  long lVar16;
  bool bVar17;
  unsigned_long *puVar18;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __i;
  pointer ppVar19;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  vector<unsigned_long,_std::allocator<unsigned_long>_> info;
  vector<unsigned_long,_std::allocator<unsigned_long>_> data;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  connections;
  vector<unsigned_long,_std::allocator<unsigned_long>_> result;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> order;
  DecHeap heap;
  pair<unsigned_long,_unsigned_long> local_138;
  unsigned_long *local_128;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  unsigned_long local_100;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  DecHeap local_60;
  
  local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_d8,this->N,(value_type_conflict *)&local_b8);
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_118,this->N,(value_type_conflict *)&local_b8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&local_f8,this->N);
  ppVar19 = (this->graph).
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->graph).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar19 != ppVar2) {
    puVar18 = &ppVar19->second;
    do {
      local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[*puVar18] =
           local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[*puVar18] + 1;
      local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start
      [((pair<unsigned_long,_unsigned_long> *)(puVar18 + -1))->first] =
           local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start
           [((pair<unsigned_long,_unsigned_long> *)(puVar18 + -1))->first] + 1;
      pvVar1 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
               (local_f8.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start +
               ((pair<unsigned_long,_unsigned_long> *)(puVar18 + -1))->first);
      iVar3._M_current = *(unsigned_long **)(pvVar1 + 8);
      if (iVar3._M_current == *(unsigned_long **)(pvVar1 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(pvVar1,iVar3,puVar18);
      }
      else {
        *iVar3._M_current = *puVar18;
        *(unsigned_long **)(pvVar1 + 8) = iVar3._M_current + 1;
      }
      pvVar1 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
               (local_f8.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + *puVar18);
      iVar3._M_current = *(unsigned_long **)(pvVar1 + 8);
      if (iVar3._M_current == *(unsigned_long **)(pvVar1 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(pvVar1,iVar3,puVar18 + -1);
      }
      else {
        *iVar3._M_current = ((pair<unsigned_long,_unsigned_long> *)(puVar18 + -1))->first;
        *(unsigned_long **)(pvVar1 + 8) = iVar3._M_current + 1;
      }
      ppVar19 = (pointer)(puVar18 + 1);
      puVar18 = puVar18 + 2;
    } while (ppVar19 != ppVar2);
  }
  DecHeap::DecHeap(&local_60,&local_118);
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (unsigned_long *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (unsigned_long *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (unsigned_long *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (unsigned_long *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_b8,0);
  bVar17 = false;
  do {
    bVar8 = DecHeap::empty(&local_60);
    if (bVar8) {
      if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          puVar10 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            puVar10 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          uVar6 = puVar10[-1];
          if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_b8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_b8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          puVar12 = local_f8.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar6].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar5 = local_f8.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar6].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (puVar12 == puVar5) {
            uVar9 = 0;
          }
          else {
            uVar9 = 0;
            do {
              uVar9 = uVar9 | (long)(1 << ((byte)local_d8.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[*puVar12]
                                          & 0x1f));
              puVar12 = puVar12 + 1;
            } while (puVar12 != puVar5);
          }
          uVar11 = 0;
          if (~uVar9 != 0) {
            for (; (~uVar9 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
            }
          }
          if (uVar9 == 0xffffffffffffffff) {
            uVar11 = 0xffffffffffffffff;
          }
          local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] = uVar11;
        } while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_b8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      goto LAB_001019ce;
    }
    local_138 = DecHeap::pop(&local_60);
    if (local_138.first < colors) {
      psVar4 = local_f8.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_138.second].
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (psVar15 = local_f8.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_138.second].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; psVar15 != psVar4; psVar15 = psVar15 + 1) {
        DecHeap::decrease(&local_60,*psVar15,1);
      }
      if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        iVar14 = 0;
        std::deque<unsigned_long,std::allocator<unsigned_long>>::
        _M_push_back_aux<unsigned_long_const&>
                  ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,&local_138.second
                  );
      }
      else {
        *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_138.second;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        iVar14 = 0;
      }
    }
    else {
      bVar17 = true;
      iVar14 = 6;
    }
  } while (iVar14 == 0);
  if (iVar14 == 6) {
LAB_001019ce:
    local_138 = (pair<unsigned_long,_unsigned_long>)ZEXT816(0);
    local_128 = (unsigned_long *)0x0;
    if (bVar17) {
      if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      local_100 = 0;
      if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        do {
          if ((unsigned_long *)local_138.second == local_128) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_138,
                       (iterator)local_138.second,&local_100);
          }
          else {
            *(unsigned_long *)local_138.second = local_100;
            local_138.second = (unsigned_long)(local_138.second + 8);
          }
          local_100 = local_100 + 1;
        } while (local_100 <
                 (ulong)((long)local_118.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_118.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3));
      }
      uVar6 = local_138.first;
      uVar11 = local_138.second;
      if (local_138.first != local_138.second) {
        lVar16 = local_138.second - local_138.first;
        uVar9 = lVar16 >> 3;
        lVar7 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Graph::color(unsigned_long)::__0>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )local_138.first,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )local_138.second,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_SchrodingerZhu[P]backend_src_graph_cpp:63:45)>
                    )&local_118);
        if (lVar16 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<Graph::color(unsigned_long)::__0>>
                    ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )uVar6,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )uVar11,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_SchrodingerZhu[P]backend_src_graph_cpp:63:45)>
                      )&local_118);
        }
        else {
          __last._M_current = (unsigned_long *)(uVar6 + 0x80);
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<Graph::color(unsigned_long)::__0>>
                    ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )uVar6,__last,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_SchrodingerZhu[P]backend_src_graph_cpp:63:45)>
                      )&local_118);
          for (; __last._M_current != (unsigned_long *)uVar11;
              __last._M_current = __last._M_current + 1) {
            uVar13 = __last._M_current[-1];
            uVar6 = *__last._M_current;
            puVar18 = __last._M_current;
            if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar13] <
                local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6]) {
              do {
                *puVar18 = uVar13;
                uVar13 = puVar18[-2];
                puVar18 = puVar18 + -1;
              } while (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar13] <
                       local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar6]);
            }
            *puVar18 = uVar6;
          }
        }
      }
    }
    std::
    pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::
    pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
              (__return_storage_ptr__,&local_d8,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138);
    if ((void *)local_138.first != (void *)0x0) {
      operator_delete((void *)local_138.first);
    }
  }
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_b8);
  if (local_60.idx_map.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.idx_map.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.heap.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.heap.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_f8);
  if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<size_t>, std::vector<size_t>>  Graph::color(size_t colors) {
    std::vector<size_t> data;
    std::vector<size_t> result;
    std::vector<std::vector<size_t>> connections;

    result.resize(N, -1);
    data.resize(N, 0);
    connections.resize(N);

    bool failed = false;
    // degrees
    for (auto& i : graph) {
        data[i.second] += 1;
        data[i.first] += 1;
        connections[i.first].push_back(i.second);
        connections[i.second].push_back(i.first);
    }

    auto heap = DecHeap(data);
    std::stack<size_t> order;
    while (!heap.empty()) {
        auto node = heap.pop();
        if (node.first >= colors) {
            failed = true;
            goto ending;
        } else {
            for (auto & i : connections[node.second]) {
                heap.decrease(i, 1);
            }
            order.push(node.second);
        }
    }
    while (!order.empty()) {
        size_t t = order.top();
        order.pop();
        bitmask_t mask = 0;
        for (auto & i : connections[t]) {
            mark(mask, result[i]);
        }
        result[t] = get(mask);
    }
ending:
    std::vector<size_t> info;
    if (failed) {
        result.clear();
        for(size_t i = 0; i < data.size(); ++i) {
            info.push_back(i);
        }
        std::sort(info.begin(), info.end(), [&](size_t a, size_t b) {return data[a] > data[b]; });
    }
    return {result, info};
}